

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

uint aom_highbd_10_mse8x8_sse2(uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint *sse)

{
  undefined4 in_ECX;
  int *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  uint *in_R8;
  uint16_t *ref;
  uint16_t *src;
  int sum;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint16_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  highbd_10_variance_sse2
            (in_stack_ffffffffffffffd0,(int)((ulong)(in_RDI << 1) >> 0x20),
             (uint16_t *)((long)in_RDX << 1),in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb4,(uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDX
             ,(high_variance_fn_t)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)in_RDI);
  return *in_R8;
}

Assistant:

unsigned int aom_highbd_10_mse8x8_sse2(const uint8_t *src8, int src_stride,
                                       const uint8_t *ref8, int ref_stride,
                                       unsigned int *sse) {
  int sum;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  highbd_10_variance_sse2(src, src_stride, ref, ref_stride, 8, 8, sse, &sum,
                          aom_highbd_calc8x8var_sse2, 8);
  return *sse;
}